

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

int deqp::gles31::bb::anon_unknown_11::computeStd430BaseAlignment
              (VarType *type,deUint32 layoutFlags)

{
  int x;
  bool bVar1;
  DataType DVar2;
  int y;
  StructType *pSVar3;
  pointer this;
  VarType *pVVar4;
  int local_4c;
  __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
  local_40;
  __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
  local_38;
  ConstIterator memberIter;
  int maxBaseAlignment;
  int vecAlign;
  int vecSize;
  bool isRowMajor;
  DataType basicType;
  deUint32 layoutFlags_local;
  VarType *type_local;
  
  bVar1 = glu::VarType::isBasicType(type);
  if (bVar1) {
    DVar2 = glu::VarType::getBasicType(type);
    bVar1 = glu::isDataTypeMatrix(DVar2);
    if (bVar1) {
      if ((layoutFlags & 0x10) == 0) {
        local_4c = glu::getDataTypeMatrixNumRows(DVar2);
      }
      else {
        local_4c = glu::getDataTypeMatrixNumColumns(DVar2);
      }
      DVar2 = glu::getDataTypeFloatVec(local_4c);
      type_local._4_4_ = getDataTypeByteAlignment(DVar2);
    }
    else {
      type_local._4_4_ = getDataTypeByteAlignment(DVar2);
    }
  }
  else {
    bVar1 = glu::VarType::isArrayType(type);
    if (bVar1) {
      pVVar4 = glu::VarType::getElementType(type);
      type_local._4_4_ = computeStd430BaseAlignment(pVVar4,layoutFlags);
    }
    else {
      memberIter._M_current._0_4_ = 0;
      pSVar3 = glu::VarType::getStructPtr(type);
      local_38._M_current = (StructMember *)glu::StructType::begin(pSVar3);
      while( true ) {
        pSVar3 = glu::VarType::getStructPtr(type);
        local_40._M_current = (StructMember *)glu::StructType::end(pSVar3);
        bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
        x = (int)memberIter._M_current;
        if (!bVar1) break;
        this = __gnu_cxx::
               __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
               ::operator->(&local_38);
        pVVar4 = glu::StructMember::getType(this);
        y = computeStd430BaseAlignment(pVVar4,layoutFlags);
        memberIter._M_current._0_4_ = de::max<int>(x,y);
        __gnu_cxx::
        __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
        ::operator++(&local_38,0);
      }
      type_local._4_4_ = (int)memberIter._M_current;
    }
  }
  return type_local._4_4_;
}

Assistant:

int computeStd430BaseAlignment (const VarType& type, deUint32 layoutFlags)
{
	// Otherwise identical to std140 except that alignment of structures and arrays
	// are not rounded up to alignment of vec4.

	if (type.isBasicType())
	{
		glu::DataType basicType = type.getBasicType();

		if (glu::isDataTypeMatrix(basicType))
		{
			const bool	isRowMajor	= !!(layoutFlags & LAYOUT_ROW_MAJOR);
			const int	vecSize		= isRowMajor ? glu::getDataTypeMatrixNumColumns(basicType)
												 : glu::getDataTypeMatrixNumRows(basicType);
			const int	vecAlign	= getDataTypeByteAlignment(glu::getDataTypeFloatVec(vecSize));

			return vecAlign;
		}
		else
			return getDataTypeByteAlignment(basicType);
	}
	else if (type.isArrayType())
	{
		return computeStd430BaseAlignment(type.getElementType(), layoutFlags);
	}
	else
	{
		DE_ASSERT(type.isStructType());

		int maxBaseAlignment = 0;

		for (StructType::ConstIterator memberIter = type.getStructPtr()->begin(); memberIter != type.getStructPtr()->end(); memberIter++)
			maxBaseAlignment = de::max(maxBaseAlignment, computeStd430BaseAlignment(memberIter->getType(), layoutFlags));

		return maxBaseAlignment;
	}
}